

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O3

int PrintString(int printlevel,char *outline)

{
  int iVar1;
  size_t sVar2;
  FString local_20;
  
  iVar1 = 0;
  if ((msglevel.Value <= printlevel) && (*outline != '\0')) {
    if (printlevel == 5) {
      if (Logfile != (FILE *)0x0) {
        fputs(outline,(FILE *)Logfile);
        fflush((FILE *)Logfile);
      }
    }
    else {
      I_PrintStr(outline);
      FConsoleBuffer::AddText(conbuffer,printlevel,outline,Logfile);
      if (((vidactive == true) && (screen != (DFrameBuffer *)0x0)) && (SmallFont != (FFont *)0x0)) {
        FString::FString(&local_20,outline);
        FNotifyBuffer::AddString(&NotifyStrings,printlevel,&local_20);
        FString::~FString(&local_20);
        maybedrawnow(false,false);
      }
    }
    sVar2 = strlen(outline);
    iVar1 = (int)sVar2;
  }
  return iVar1;
}

Assistant:

int PrintString (int printlevel, const char *outline)
{
	if (printlevel < msglevel || *outline == '\0')
	{
		return 0;
	}

	if (printlevel != PRINT_LOG)
	{
		I_PrintStr (outline);

		AddToConsole (printlevel, outline);
		if (vidactive && screen && SmallFont)
		{
			NotifyStrings.AddString(printlevel, outline);
			maybedrawnow (false, false);
		}
	}
	else if (Logfile != NULL)
	{
		fputs (outline, Logfile);
		fflush (Logfile);
	}
	return (int)strlen (outline);
}